

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O0

void __thiscall Assimp::FBX::BlendShapeChannel::~BlendShapeChannel(BlendShapeChannel *this)

{
  BlendShapeChannel *this_local;
  
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__BlendShapeChannel_00ecb4e8;
  std::
  vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>::
  ~vector(&this->shapeGeometries);
  std::vector<float,_std::allocator<float>_>::~vector(&this->fullWeights);
  Deformer::~Deformer(&this->super_Deformer);
  return;
}

Assistant:

BlendShapeChannel::~BlendShapeChannel()
{

}